

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

bb_t_conflict create_bb(gen_ctx_t gen_ctx,MIR_insn_t insn)

{
  bb_t_conflict bb_00;
  bitmap_t pVVar1;
  bb_t_conflict bb;
  MIR_insn_t insn_local;
  gen_ctx_t gen_ctx_local;
  
  bb_00 = (bb_t_conflict)gen_malloc(gen_ctx,0xa8);
  bb_00->bfs = 0;
  bb_00->rpost = 0;
  bb_00->pre = 0;
  bb_00->loop_node = (loop_node_t_conflict)0x0;
  DLIST_bb_insn_t_init(&bb_00->bb_insns);
  DLIST_in_edge_t_init(&bb_00->in_edges);
  DLIST_out_edge_t_init(&bb_00->out_edges);
  bb_00->reachable_p = '\0';
  bb_00->flag = '\0';
  bb_00->call_p = '\0';
  pVVar1 = bitmap_create2(0x100);
  bb_00->in = pVVar1;
  pVVar1 = bitmap_create2(0x100);
  bb_00->out = pVVar1;
  pVVar1 = bitmap_create2(0x100);
  bb_00->gen = pVVar1;
  pVVar1 = bitmap_create2(0x100);
  bb_00->kill = pVVar1;
  pVVar1 = bitmap_create2(0x100);
  bb_00->dom_in = pVVar1;
  pVVar1 = bitmap_create2(0x100);
  bb_00->dom_out = pVVar1;
  bb_00->max_fp_pressure = 0;
  bb_00->max_int_pressure = 0;
  if (insn != (MIR_insn_t)0x0) {
    if (gen_ctx->optimize_level == 0) {
      setup_insn_data(gen_ctx,insn,bb_00);
    }
    else {
      add_new_bb_insn(gen_ctx,insn,bb_00,1);
    }
  }
  return bb_00;
}

Assistant:

static bb_t create_bb (gen_ctx_t gen_ctx, MIR_insn_t insn) {
  bb_t bb = gen_malloc (gen_ctx, sizeof (struct bb));

  bb->pre = bb->rpost = bb->bfs = 0;
  bb->loop_node = NULL;
  DLIST_INIT (bb_insn_t, bb->bb_insns);
  DLIST_INIT (in_edge_t, bb->in_edges);
  DLIST_INIT (out_edge_t, bb->out_edges);
  bb->call_p = bb->flag = bb->reachable_p = FALSE;
  bb->in = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  bb->out = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  bb->gen = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  bb->kill = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  bb->dom_in = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  bb->dom_out = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  bb->max_int_pressure = bb->max_fp_pressure = 0;
  if (insn != NULL) {
    if (optimize_level == 0)
      setup_insn_data (gen_ctx, insn, bb);
    else
      add_new_bb_insn (gen_ctx, insn, bb, TRUE);
  }
  return bb;
}